

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::FixVariablePS(FixVariablePS *this,FixVariablePS *old)

{
  long in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffffa0;
  
  PostStep::PostStep((PostStep *)in_stack_ffffffffffffffa0,(PostStep *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__FixVariablePS_004f0cc0;
  in_RDI->exp = *(int *)(in_RSI + 0x28);
  *(undefined4 *)&in_RDI->neg = *(undefined4 *)(in_RSI + 0x2c);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffa0,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffa0,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffa0,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffffa0,in_RDI);
  *(undefined1 *)&in_RDI[4].fpclass = *(byte *)(in_RSI + 0x110) & cpp_dec_float_inf;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffffa0,
                 (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI);
  return;
}

Assistant:

FixVariablePS(const FixVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_val(old.m_val)
         , m_obj(old.m_obj)
         , m_lower(old.m_lower)
         , m_upper(old.m_upper)
         , m_correctIdx(old.m_correctIdx)
         , m_col(old.m_col)
      {}